

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::ResultBuilder::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,ResultBuilder *this)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ResultBuilder *local_18;
  ResultBuilder *this_local;
  
  local_18 = this;
  this_local = (ResultBuilder *)__return_storage_ptr__;
  bVar1 = std::operator==(&(this->m_exprComponents).op,"");
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+(__return_storage_ptr__,&(this->m_exprComponents).op,
                     &(this->m_exprComponents).lhs);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)&(this->m_assertionInfo).capturedExpression);
    }
  }
  else {
    bVar1 = std::operator==(&(this->m_exprComponents).op,"matches");
    if (bVar1) {
      std::operator+(&local_38,&(this->m_exprComponents).lhs," ");
      std::operator+(__return_storage_ptr__,&local_38,&(this->m_exprComponents).rhs);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else {
      bVar1 = std::operator!=(&(this->m_exprComponents).op,"!");
      if (bVar1) {
        lVar3 = std::__cxx11::string::size();
        lVar4 = std::__cxx11::string::size();
        if ((((ulong)(lVar3 + lVar4) < 0x28) &&
            (lVar3 = std::__cxx11::string::find((char *)&(this->m_exprComponents).lhs,0x1b4b71),
            lVar3 == -1)) &&
           (lVar3 = std::__cxx11::string::find((char *)&(this->m_exprComponents).rhs,0x1b4b71),
           lVar3 == -1)) {
          std::operator+(&local_a8,&(this->m_exprComponents).lhs," ");
          std::operator+(&local_88,&local_a8,&(this->m_exprComponents).op);
          std::operator+(&local_68,&local_88," ");
          std::operator+(__return_storage_ptr__,&local_68,&(this->m_exprComponents).rhs);
          std::__cxx11::string::~string((string *)&local_68);
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_a8);
        }
        else {
          std::operator+(&local_108,&(this->m_exprComponents).lhs,"\n");
          std::operator+(&local_e8,&local_108,&(this->m_exprComponents).op);
          std::operator+(&local_c8,&local_e8,"\n");
          std::operator+(__return_storage_ptr__,&local_c8,&(this->m_exprComponents).rhs);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_108);
        }
      }
      else {
        std::operator+(&local_1e8,"{can\'t expand - use ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        std::operator+(&local_1c8,&local_1e8,"_FALSE( ");
        std::__cxx11::string::substr
                  ((ulong)&local_208,(ulong)&(this->m_assertionInfo).capturedExpression);
        std::operator+(&local_1a8,&local_1c8,&local_208);
        std::operator+(&local_188,&local_1a8," ) instead of ");
        std::operator+(&local_168,&local_188,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
        std::operator+(&local_148,&local_168,"( ");
        std::operator+(&local_128,&local_148,&(this->m_assertionInfo).capturedExpression);
        std::operator+(__return_storage_ptr__,&local_128," ) for better diagnostics}");
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ResultBuilder::reconstructExpression() const {
        if( m_exprComponents.op == "" )
            return m_exprComponents.lhs.empty() ? m_assertionInfo.capturedExpression : m_exprComponents.op + m_exprComponents.lhs;
        else if( m_exprComponents.op == "matches" )
            return m_exprComponents.lhs + " " + m_exprComponents.rhs;
        else if( m_exprComponents.op != "!" ) {
            if( m_exprComponents.lhs.size() + m_exprComponents.rhs.size() < 40 &&
                m_exprComponents.lhs.find("\n") == std::string::npos &&
                m_exprComponents.rhs.find("\n") == std::string::npos )
                return m_exprComponents.lhs + " " + m_exprComponents.op + " " + m_exprComponents.rhs;
            else
                return m_exprComponents.lhs + "\n" + m_exprComponents.op + "\n" + m_exprComponents.rhs;
        }
        else
            return "{can't expand - use " + m_assertionInfo.macroName + "_FALSE( " + m_assertionInfo.capturedExpression.substr(1) + " ) instead of " + m_assertionInfo.macroName + "( " + m_assertionInfo.capturedExpression + " ) for better diagnostics}";
    }